

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O0

void __thiscall
gl4cts::SimpleQueriesTestCase::testSipmleQueries
          (SimpleQueriesTestCase *this,Functions *gl,GLint pname)

{
  GLenum GVar1;
  ostream *poVar2;
  TestError *this_00;
  char *message;
  GLboolean local_1d9;
  GLboolean value_bool;
  GLdouble value_double;
  GLfloat value_float;
  GLint64 value_int64;
  bool local_1b5;
  GLint value_int;
  bool result;
  stringstream local_1a8 [8];
  stringstream log;
  ostream local_198;
  GLenum local_1c;
  Functions *pFStack_18;
  GLint pname_local;
  Functions *gl_local;
  SimpleQueriesTestCase *this_local;
  
  local_1c = pname;
  pFStack_18 = gl;
  gl_local = (Functions *)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar2 = std::operator<<(&local_198,"Testing simple query for pname: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c);
  std::operator<<(poVar2," - ");
  local_1b5 = true;
  (*pFStack_18->getIntegerv)(local_1c,(GLint *)((long)&value_int64 + 4));
  GVar1 = (*pFStack_18->getError)();
  local_1b5 = SparseTextureUtils::verifyError((stringstream *)local_1a8,"getIntegerv",GVar1,0);
  if (local_1b5) {
    (*pFStack_18->getInteger64v)(local_1c,(GLint64 *)&stack0xfffffffffffffe38);
    GVar1 = (*pFStack_18->getError)();
    local_1b5 = SparseTextureUtils::verifyError((stringstream *)local_1a8,"getInteger64v",GVar1,0);
    if (local_1b5) {
      (*pFStack_18->getFloatv)(local_1c,(GLfloat *)((long)&value_double + 4));
      GVar1 = (*pFStack_18->getError)();
      local_1b5 = SparseTextureUtils::verifyError((stringstream *)local_1a8,"getFloatv",GVar1,0);
      if (local_1b5) {
        (*pFStack_18->getDoublev)(local_1c,(GLdouble *)&stack0xfffffffffffffe28);
        GVar1 = (*pFStack_18->getError)();
        local_1b5 = SparseTextureUtils::verifyError((stringstream *)local_1a8,"getDoublev",GVar1,0);
        if (local_1b5) {
          (*pFStack_18->getBooleanv)(local_1c,&local_1d9);
          GVar1 = (*pFStack_18->getError)();
          local_1b5 = SparseTextureUtils::verifyError
                                ((stringstream *)local_1a8,"getBooleanv",GVar1,0);
        }
      }
    }
  }
  if (local_1b5 != false) {
    std::__cxx11::stringstream::~stringstream(local_1a8);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  message = (char *)std::__cxx11::string::c_str();
  tcu::TestError::TestError
            (this_00,message,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
             ,0x3ed);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void SimpleQueriesTestCase::testSipmleQueries(const Functions& gl, GLint pname)
{
	std::stringstream log;
	log << "Testing simple query for pname: " << pname << " - ";

	bool result = true;

	GLint	 value_int;
	GLint64   value_int64;
	GLfloat   value_float;
	GLdouble  value_double;
	GLboolean value_bool;

	gl.getIntegerv(pname, &value_int);
	result = SparseTextureUtils::verifyError(log, "getIntegerv", gl.getError(), GL_NO_ERROR);

	if (result)
	{
		gl.getInteger64v(pname, &value_int64);
		result = SparseTextureUtils::verifyError(log, "getInteger64v", gl.getError(), GL_NO_ERROR);

		if (result)
		{
			gl.getFloatv(pname, &value_float);
			result = SparseTextureUtils::verifyError(log, "getFloatv", gl.getError(), GL_NO_ERROR);

			if (result)
			{
				gl.getDoublev(pname, &value_double);
				result = SparseTextureUtils::verifyError(log, "getDoublev", gl.getError(), GL_NO_ERROR);

				if (result)
				{
					gl.getBooleanv(pname, &value_bool);
					result = SparseTextureUtils::verifyError(log, "getBooleanv", gl.getError(), GL_NO_ERROR);
				}
			}
		}
	}

	if (!result)
	{
		TCU_FAIL(log.str().c_str());
	}
}